

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_migrate.cpp
# Opt level: O1

Dist * Omega_h::get_new_copies2old_owners
                 (Dist *__return_storage_ptr__,Dist *uses2old_owners,GOs *old_owner_globals)

{
  int *piVar1;
  Alloc *pAVar2;
  LOs old_owners2items;
  Dist old_owners2uniq_uses;
  GOs local_158;
  Alloc *local_148;
  Dist local_138;
  Dist local_a8;
  
  Dist::Dist(&local_a8,uses2old_owners);
  get_old_owners2uniq_uses(&local_138,&local_a8);
  Dist::~Dist(&local_a8);
  Dist::roots2items(&local_138);
  local_158.write_.shared_alloc_.alloc = (old_owner_globals->write_).shared_alloc_.alloc;
  if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
      local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_158.write_.shared_alloc_.alloc =
           (Alloc *)((local_158.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_158.write_.shared_alloc_.alloc)->use_count =
           (local_158.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_158.write_.shared_alloc_.direct_ptr = (old_owner_globals->write_).shared_alloc_.direct_ptr;
  Dist::set_dest_globals(&local_138,&local_158);
  pAVar2 = local_158.write_.shared_alloc_.alloc;
  if (((ulong)local_158.write_.shared_alloc_.alloc & 7) == 0 &&
      local_158.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_158.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_158.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  Dist::invert(__return_storage_ptr__,&local_138);
  if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
    piVar1 = &local_148->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148);
      operator_delete(local_148,0x48);
    }
  }
  Dist::~Dist(&local_138);
  return __return_storage_ptr__;
}

Assistant:

Dist get_new_copies2old_owners(Dist uses2old_owners, GOs old_owner_globals) {
  auto old_owners2uniq_uses = get_old_owners2uniq_uses(uses2old_owners);
  auto old_owners2items = old_owners2uniq_uses.roots2items();
  old_owners2uniq_uses.set_dest_globals(old_owner_globals);
  auto uniq_uses2old_owners = old_owners2uniq_uses.invert();
  return uniq_uses2old_owners;
}